

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

ImGuiWindowSettings * ImGui::FindWindowSettings(ImGuiID id)

{
  int iVar1;
  char *pcVar2;
  ImGuiWindowSettings *pIVar3;
  ImGuiWindowSettings *pIVar4;
  
  pcVar2 = (GImGui->SettingsWindows).Buf.Data;
  if (pcVar2 != (char *)0x0) {
    pIVar4 = (ImGuiWindowSettings *)(pcVar2 + 4);
    pIVar3 = pIVar4;
    do {
      if (pIVar3->ID == id) {
        return pIVar3;
      }
      iVar1._0_1_ = pIVar3[-1].Collapsed;
      iVar1._1_1_ = pIVar3[-1].WantApply;
      iVar1._2_2_ = *(undefined2 *)&pIVar3[-1].field_0xe;
      pIVar3 = (ImGuiWindowSettings *)((long)&pIVar3->ID + (long)iVar1);
    } while (pIVar3 != (ImGuiWindowSettings *)
                       ((long)&pIVar4->ID + (long)(GImGui->SettingsWindows).Buf.Size));
  }
  return (ImGuiWindowSettings *)0x0;
}

Assistant:

ImGuiWindowSettings* ImGui::FindWindowSettings(ImGuiID id)
{
    ImGuiContext& g = *GImGui;
    for (ImGuiWindowSettings* settings = g.SettingsWindows.begin(); settings != NULL; settings = g.SettingsWindows.next_chunk(settings))
        if (settings->ID == id)
            return settings;
    return NULL;
}